

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool __thiscall SemanticVersionOutput::Run(SemanticVersionOutput *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  Version v;
  ostringstream s;
  string local_200;
  Version local_1e0;
  string local_190 [3];
  ios_base local_120 [264];
  
  local_190[0]._M_dataplus._M_p = (pointer)&local_190[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"alpha.2","");
  paVar1 = &local_200.field_2;
  local_200._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"1234","");
  semver::v2::Version::Version(&local_1e0,1,2,3,local_190,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190[0]._M_dataplus._M_p != &local_190[0].field_2) {
    operator_delete(local_190[0]._M_dataplus._M_p,local_190[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  semver::v2::operator<<((ostream *)local_190,&local_1e0);
  std::__cxx11::stringbuf::str();
  iVar2 = std::__cxx11::string::compare((char *)&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_buildVersion._M_dataplus._M_p != &local_1e0.m_buildVersion.field_2) {
    operator_delete(local_1e0.m_buildVersion._M_dataplus._M_p,
                    local_1e0.m_buildVersion.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_prereleaseVersion._M_dataplus._M_p != &local_1e0.m_prereleaseVersion.field_2) {
    operator_delete(local_1e0.m_prereleaseVersion._M_dataplus._M_p,
                    local_1e0.m_prereleaseVersion.field_2._M_allocated_capacity + 1);
  }
  return iVar2 == 0;
}

Assistant:

DEF_TEST(Satisfies_v1, SemanticVersion)
{
  return adjacent_find(
      s_precedences_v1.cbegin(), s_precedences_v1.cend(),
      [] (const auto& a, const auto& b) { return !b.Satisfies(a) ; })
    == s_precedences_v1.end();
}